

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationHistory.cpp
# Opt level: O0

void __thiscall
ObservationHistory::ObservationHistory(ObservationHistory *this,Index obsI,ObservationHistory *pred)

{
  size_t sVar1;
  History *in_RDX;
  undefined4 in_ESI;
  History *in_RDI;
  IndividualHistory *in_stack_ffffffffffffffd0;
  
  IndividualHistory::IndividualHistory(in_stack_ffffffffffffffd0,(Index)((ulong)in_RDI >> 0x20));
  in_RDI->_vptr_History = (_func_int **)&PTR__ObservationHistory_00d307d8;
  in_RDI[2]._m_length = in_RDX[2]._m_length;
  sVar1 = History::GetLength(in_RDX);
  History::SetLength(in_RDI,sVar1 + 1);
  *(undefined4 *)((long)&in_RDI[1]._vptr_History + 4) = in_ESI;
  *(undefined1 *)&in_RDI[1]._m_length = 0;
  in_RDI[2]._vptr_History = (_func_int **)in_RDX;
  return;
}

Assistant:

ObservationHistory::ObservationHistory(Index obsI, ObservationHistory* pred):
    IndividualHistory(pred->_m_agentI),
    _m_PlanningUnitMADPDiscrete(pred->_m_PlanningUnitMADPDiscrete)
{
    SetLength(pred->GetLength() + 1);
    _m_observationI = obsI;
    _m_containsEmptyOI = false;
    _m_pred = pred;
}